

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<float,_4> *write_value,
          Vector<float,_4> *expected_value)

{
  CallLogWrapper *pCVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  GLuint GVar5;
  GLint GVar6;
  uint uVar7;
  char *pcVar8;
  undefined *puVar9;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  Vector<float,_4> *v_01;
  Vector<float,_4> *v_02;
  Vector<float,_4> *v_03;
  GLenum GVar10;
  string *this_00;
  GLenum GVar11;
  LoadStoreMachine *this_01;
  Vector<float,_4> *in_R8;
  Vector<float,_4> *pVVar12;
  _Alloc_hider _Var13;
  GLsizei GVar14;
  long lVar15;
  vec4 *v1;
  int i_1;
  GLenum *pGVar16;
  int i;
  ulong uVar17;
  GLuint local_210;
  GLuint local_20c;
  GLuint texture_result;
  string local_1f0;
  uint local_1d0;
  GLenum local_1cc;
  GLuint textures [8];
  vec4 color;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string source;
  Vector<float,_4> data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  long local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  TestLog *local_78;
  Functions *pFStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  v1 = (vec4 *)(ulong)internalformat;
  this_01 = (LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c);
  GVar10 = (GLenum)write_value;
  GVar11 = (GLenum)expected_value;
  switch(this_01) {
  case (LoadStoreMachine *)0x0:
    GenStoreShader<tcu::Vector<float,4>>(&source,this_01,internalformat,GVar10,in_R8);
    pVVar12 = (Vector<float,_4> *)0x0;
    local_20c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<float,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar11,
               pVVar12);
    local_210 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x1:
    GenStoreShader<tcu::Vector<float,4>>(&source,this_01,internalformat,GVar10,in_R8);
    pVVar12 = (Vector<float,_4> *)0x0;
    local_20c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           source._M_dataplus._M_p,
                           "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                           (char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<float,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar11,
               pVVar12);
    local_210 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           source._M_dataplus._M_p,
                           "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                           (char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x2:
    GenStoreShader<tcu::Vector<float,4>>(&source,this_01,internalformat,GVar10,in_R8);
    pVVar12 = (Vector<float,_4> *)0x0;
    local_20c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<float,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar11,
               pVVar12);
    local_210 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x3:
    GenStoreShader<tcu::Vector<float,4>>(&source,this_01,internalformat,GVar10,in_R8);
    _Var13 = source._M_dataplus;
    local_20c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<float,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar11,
               (Vector<float,_4> *)_Var13._M_p);
    local_210 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x4:
    GenStoreShader<tcu::Vector<float,4>>(&source,this_01,internalformat,GVar10,in_R8);
    textures._0_8_ = source._M_dataplus._M_p;
    pCVar1 = (CallLogWrapper *)(this + 8);
    GVar5 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
    pVVar12 = (Vector<float,_4> *)0x0;
    glu::CallLogWrapper::glShaderSource(pCVar1,GVar5,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar5);
    local_20c = glu::CallLogWrapper::glCreateProgram(pCVar1);
    glu::CallLogWrapper::glAttachShader(pCVar1,local_20c,GVar5);
    glu::CallLogWrapper::glLinkProgram(pCVar1,local_20c);
    glu::CallLogWrapper::glDeleteShader(pCVar1,GVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<float,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar11,
               pVVar12);
    textures._0_8_ = source._M_dataplus._M_p;
    GVar5 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
    glu::CallLogWrapper::glShaderSource(pCVar1,GVar5,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar5);
    local_210 = glu::CallLogWrapper::glCreateProgram(pCVar1);
    glu::CallLogWrapper::glAttachShader(pCVar1,local_210,GVar5);
    glu::CallLogWrapper::glLinkProgram(pCVar1,local_210);
    glu::CallLogWrapper::glDeleteShader(pCVar1,GVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p == &source.field_2) goto LAB_009c5b84;
    goto LAB_009c5b62;
  default:
    local_210 = 0;
    local_20c = 0;
    goto LAB_009c5b84;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
LAB_009c5b62:
    operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
  }
LAB_009c5b84:
  pCVar1 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(pCVar1,8,textures);
  glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
  pGVar16 = &DAT_01abb5d0;
  uVar17 = 0;
  do {
    GVar10 = *pGVar16;
    glu::CallLogWrapper::glBindTexture(pCVar1,GVar10,textures[uVar17]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,GVar10,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,GVar10,0x2800,0x2600);
    switch(uVar17 & 0xffffffff) {
    case 0:
      glu::CallLogWrapper::glTexStorage1D(pCVar1,0xde0,1,internalformat,1);
      break;
    case 1:
    case 3:
      goto LAB_009c5d03;
    case 2:
    case 6:
      GVar14 = 2;
      goto LAB_009c5cee;
    case 4:
      GVar10 = 0x8513;
LAB_009c5d03:
      GVar14 = 1;
LAB_009c5d37:
      glu::CallLogWrapper::glTexStorage2D(pCVar1,GVar10,1,internalformat,1,GVar14);
      break;
    case 5:
      GVar10 = 0x8c18;
      GVar14 = 2;
      goto LAB_009c5d37;
    case 7:
      GVar10 = 0x9009;
      GVar14 = 0xc;
LAB_009c5cee:
      glu::CallLogWrapper::glTexStorage3D(pCVar1,GVar10,1,internalformat,1,1,GVar14);
    }
    uVar17 = uVar17 + 1;
    pGVar16 = pGVar16 + 1;
    if (uVar17 == 8) {
      glu::CallLogWrapper::glBindImageTexture(pCVar1,0,textures[0],0,'\0',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[1],0,'\0',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[2],0,'\x01',0,0x88b9,internalformat)
      ;
      glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[3],0,'\0',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[4],0,'\x01',0,0x88b9,internalformat)
      ;
      glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[5],0,'\x01',0,0x88b9,internalformat)
      ;
      glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[6],0,'\x01',0,0x88b9,internalformat)
      ;
      glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[7],0,'\x01',0,0x88b9,internalformat)
      ;
      glu::CallLogWrapper::glUseProgram(pCVar1,local_20c);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_1d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,0);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,1);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,2);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,3);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_cube");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,4);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,5);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,6);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_20c,"g_image_cube_array");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,7);
      glu::CallLogWrapper::glBindVertexArray(pCVar1,*(GLuint *)(this + 0x28));
      if (*(int *)(this + 0x2c) - 1U < 2) {
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
        glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
      }
      else if (*(int *)(this + 0x2c) == 4) {
        glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      }
      else {
        glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
      }
      uVar17 = CONCAT71((int7)((ulong)pCVar1 >> 8),1);
      lVar15 = 0;
      do {
        local_1d0 = (uint)uVar17;
        GVar10 = (&DAT_01abb5d0)[lVar15];
        glu::CallLogWrapper::glBindTexture(pCVar1,GVar10,textures[lVar15]);
        glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
        local_1cc = GVar10;
        local_90 = lVar15;
        if (lVar15 == 4) {
          GVar10 = 0x8515;
          uVar17 = (ulong)local_1d0;
          do {
            data.m_data[0] = 0.0;
            data.m_data[1] = 0.0;
            data.m_data[2] = 0.0;
            data.m_data[3] = 0.0;
            GVar11 = 0x1908;
            glu::CallLogWrapper::glGetTexImage
                      (pCVar1,GVar10,0,0x1908,0x1406,(ShaderImageLoadStoreBase *)&data);
            bVar4 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                              ((ShaderImageLoadStoreBase *)&data,expected_value,v1,GVar11);
            if (!bVar4) {
              local_58[0] = data.m_data[0];
              local_58[1] = data.m_data[1];
              afStack_50[0] = data.m_data[2];
              afStack_50[1] = data.m_data[3];
              ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&source,local_58,v);
              _Var3 = source._M_dataplus;
              local_68 = *(undefined8 *)expected_value->m_data;
              uStack_60 = *(undefined8 *)(expected_value->m_data + 2);
              ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&local_1f0,&local_68,v_00);
              _Var13._M_p = local_1f0._M_dataplus._M_p;
              GVar11 = internalformat;
              ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_((string *)&color,v1,e);
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                        ((ShaderImageLoadStoreBase *)(ulong)local_1cc,GVar11);
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                        ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),GVar11);
              gl4cts::anon_unknown_0::Output
                        ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                         ,_Var3._M_p,_Var13._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)color.m_data._0_8_ != &local_188) {
                operator_delete((void *)color.m_data._0_8_,local_188._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)source._M_dataplus._M_p != &source.field_2) {
                operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
              }
              uVar17 = 0;
            }
            GVar10 = GVar10 + 1;
          } while (GVar10 != 0x851b);
        }
        else {
          memset(&source,0,0xc0);
          memset(&source,0,0xc0);
          puVar9 = (undefined *)0x1908;
          glu::CallLogWrapper::glGetTexImage(pCVar1,GVar10,0,0x1908,0x1406,&source);
          uVar7 = (int)lVar15 - 2;
          lVar15 = 1;
          if (uVar7 < 6) {
            puVar9 = &DAT_01aab558;
            lVar15 = *(long *)(&DAT_01aab558 + (ulong)uVar7 * 8);
          }
          this_00 = &source;
          uVar17 = (ulong)local_1d0;
          do {
            bVar4 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                              ((ShaderImageLoadStoreBase *)this_00,expected_value,v1,(GLenum)puVar9)
            ;
            if (!bVar4) {
              local_78 = (TestLog *)
                         (((SubcaseBase *)&this_00->_M_dataplus)->super_GLWrapper)._vptr_GLWrapper;
              pFStack_70 = ((CallLogWrapper *)&this_00->_M_string_length)->m_gl;
              ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&local_1f0,&local_78,v_01);
              _Var13._M_p = local_1f0._M_dataplus._M_p;
              local_88 = *(undefined8 *)expected_value->m_data;
              uStack_80 = *(undefined8 *)(expected_value->m_data + 2);
              ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                        ((string *)&color,&local_88,v_02);
              uVar2 = color.m_data._0_8_;
              GVar10 = internalformat;
              ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_((string *)&data,v1,e_00);
              puVar9 = (undefined *)data.m_data._0_8_;
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                        ((ShaderImageLoadStoreBase *)(ulong)local_1cc,GVar10);
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                        ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),GVar10);
              gl4cts::anon_unknown_0::Output
                        ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                         ,_Var13._M_p,uVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)data.m_data._0_8_ != &local_a8) {
                operator_delete((void *)data.m_data._0_8_,
                                (ulong)(local_a8._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)color.m_data._0_8_ != &local_188) {
                operator_delete((void *)color.m_data._0_8_,local_188._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              uVar17 = 0;
            }
            this_00 = (string *)&this_00->field_2;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        lVar15 = local_90 + 1;
      } while (lVar15 != 8);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[1],0,'\0',0,35000,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[2],0,'\x01',0,35000,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[3],0,'\0',0,35000,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[4],0,'\x01',0,35000,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[5],0,'\x01',0,35000,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[6],0,'\x01',0,35000,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[7],0,'\x01',0,35000,internalformat);
      glu::CallLogWrapper::glUseProgram(pCVar1,local_210);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_result");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,0);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,1);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,2);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,3);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_cube");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,4);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,5);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,6);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_210,"g_image_cube_array");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,7);
      if (*(int *)(this + 0x2c) - 1U < 2) {
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
        glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
      }
      else if (*(int *)(this + 0x2c) == 4) {
        glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      }
      else {
        glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
      }
      color.m_data[0] = 0.0;
      color.m_data[1] = 0.0;
      color.m_data[2] = 0.0;
      color.m_data[3] = 0.0;
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
      lVar15 = 0;
      glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
      source._M_dataplus._M_p = (pointer)0x3f80000000000000;
      source._M_string_length = 0x3f80000000000000;
      bVar4 = true;
      do {
        if (bVar4) {
          bVar4 = *(float *)((long)&source._M_dataplus._M_p + lVar15 * 4) == color.m_data[lVar15];
        }
        else {
          bVar4 = false;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      if (!bVar4) {
        local_48[0] = color.m_data[0];
        local_48[1] = color.m_data[1];
        afStack_40[0] = color.m_data[2];
        afStack_40[1] = color.m_data[3];
        ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&source,local_48,v_03);
        _Var3 = source._M_dataplus;
        ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_1f0,v1,e_01);
        _Var13._M_p = local_1f0._M_dataplus._M_p;
        pcVar8 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                           ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),internalformat
                           );
        gl4cts::anon_unknown_0::Output
                  ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var3._M_p,_Var13._M_p,pcVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)source._M_dataplus._M_p != &source.field_2) {
          operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
        }
        uVar17 = 0;
      }
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,local_20c);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,local_210);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,8,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      return (bool)((byte)uVar17 & 1);
    }
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_2D,
								   GL_TEXTURE_3D,		GL_TEXTURE_RECTANGLE,
								   GL_TEXTURE_CUBE_MAP, GL_TEXTURE_1D_ARRAY,
								   GL_TEXTURE_2D_ARRAY, GL_TEXTURE_CUBE_MAP_ARRAY };
		const int kTargets		= sizeof(targets) / sizeof(targets[0]);
		GLuint	program_store = 0;
		GLuint	program_load  = 0;
		if (m_stage == 0)
		{ // VS
			program_store =
				BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL, NULL, NULL);
			program_load =
				BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL, NULL, NULL);
		}
		else if (m_stage == 1)
		{ // TCS
			const char* const glsl_vs  = "#version 420 core" NL "void main() {}";
			const char* const glsl_tes = "#version 420 core" NL "layout(quads, point_mode) in;" NL "void main() {}";
			program_store = BuildProgram(glsl_vs, GenStoreShader(m_stage, internalformat, write_value).c_str(),
										 glsl_tes, NULL, NULL);
			program_load = BuildProgram(glsl_vs, GenLoadShader(m_stage, internalformat, expected_value).c_str(),
										glsl_tes, NULL, NULL);
		}
		else if (m_stage == 2)
		{ // TES
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL);
		}
		else if (m_stage == 3)
		{ // GS
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL);
		}
		else if (m_stage == 4)
		{ // CS
			{
				std::string		  source = GenStoreShader(m_stage, internalformat, write_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_store = glCreateProgram();
				glAttachShader(program_store, sh);
				glLinkProgram(program_store);
				glDeleteShader(sh);
			}
			{
				std::string		  source = GenLoadShader(m_stage, internalformat, expected_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_load = glCreateProgram();
				glAttachShader(program_load, sh);
				glLinkProgram(program_load);
				glDeleteShader(sh);
			}
		}
		GLuint textures[kTargets], texture_result;
		glGenTextures(kTargets, textures);
		glGenTextures(1, &texture_result);

		glBindTexture(GL_TEXTURE_2D, texture_result);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 1, 1);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_1D)
			{
				glTexStorage1D(targets[i], 1, internalformat, 1);
			}
			else if (targets[i] == GL_TEXTURE_2D || targets[i] == GL_TEXTURE_RECTANGLE)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 12);
			}
			else if (targets[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 2);
			}
		}
		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program_store);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_store, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube_array"), 7);

		glBindVertexArray(m_vao);
		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		bool status = true;
		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				for (int face = 0; face < 6; ++face)
				{
					T data;
					glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
					if (!Equal(data, expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
			else
			{
				T data[12];
				memset(&data[0], 0, sizeof(data));
				glGetTexImage(targets[i], 0, Format<T>(), Type<T>(), &data[0]);

				int count = 1;
				if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
					count = 2;
				else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
					count = 12;
				else if (targets[i] == GL_TEXTURE_1D_ARRAY)
					count = 2;

				for (int j = 0; j < count; ++j)
				{
					if (!Equal(data[j], expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data[j]).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
		}
		glBindImageTexture(0, texture_result, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glUseProgram(program_load);
		glUniform1i(glGetUniformLocation(program_load, "g_image_result"), 0);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_load, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_load, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube_array"), 7);

		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}
		{
			vec4 color;
			glBindTexture(GL_TEXTURE_2D, texture_result);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &color[0]);
			if (!tcu::allEqual(color, vec4(0, 1, 0, 1)))
			{
				status = false;
				Output("Color is: %s. Format is: %s. Stage is: %s.\n", ToString(color).c_str(),
					   FormatEnumToString(internalformat).c_str(), StageName(m_stage));
			}
		}
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		glDeleteTextures(1, &texture_result);
		return status;
	}